

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_log_helper.h
# Opt level: O2

void __thiscall
spdlog::details::async_log_helper::handle_flush_interval
          (async_log_helper *this,time_point *now,time_point *last_flush)

{
  long lVar1;
  pointer psVar2;
  rep rVar3;
  shared_ptr<spdlog::sinks::sink> *s;
  pointer psVar4;
  
  if ((this->_flush_requested != false) ||
     ((lVar1 = (this->_flush_interval_ms).__r, lVar1 != 0 &&
      (lVar1 * 1000000 <= (now->__d).__r - (last_flush->__d).__r)))) {
    psVar2 = (this->_sinks).
             super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar4 = (this->_sinks).
                  super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar2; psVar4 = psVar4 + 1)
    {
      (*((psVar4->super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        _vptr_sink[3])();
    }
    rVar3 = std::chrono::_V2::system_clock::now();
    (last_flush->__d).__r = rVar3;
    (now->__d).__r = rVar3;
    this->_flush_requested = false;
  }
  return;
}

Assistant:

inline void spdlog::details::async_log_helper::handle_flush_interval(log_clock::time_point &now, log_clock::time_point &last_flush)
{
    auto should_flush =
        _flush_requested || (_flush_interval_ms != std::chrono::milliseconds::zero() && now - last_flush >= _flush_interval_ms);
    if (should_flush)
    {
        for (auto &s : _sinks)
        {
            s->flush();
        }
        now = last_flush = details::os::now();
        _flush_requested = false;
    }
}